

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  BoxFactory *this;
  string *psVar2;
  char *__assertion;
  allocator local_b9;
  string color;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this = (BoxFactory *)operator_new(0x40);
  *(undefined8 *)&(this->map)._M_h._M_rehash_policy = 0;
  (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map)._M_h._M_buckets = &(this->map)._M_h._M_single_bucket;
  (this->map)._M_h._M_bucket_count = 1;
  (this->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map)._M_h._M_element_count = 0;
  (this->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->box).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Box_*>,_true>
  ._M_cur = (__node_type *)0x0;
  std::__cxx11::string::string((string *)&local_38,"red",(allocator *)&color);
  psVar2 = (string *)BoxFactory::getBox(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_58,"red",(allocator *)&color);
  BoxFactory::getBox(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&color,psVar2);
  bVar1 = std::operator==(&color,"red");
  if (bVar1) {
    if ((int)(this->map)._M_h._M_element_count == 1) {
      std::__cxx11::string::string((string *)&local_78,"green",&local_b9);
      BoxFactory::getBox(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)&local_98,"green",&local_b9);
      BoxFactory::getBox(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if ((int)(this->map)._M_h._M_element_count == 2) {
        std::__cxx11::string::~string((string *)&color);
        return 0;
      }
      __assertion = "boxcount == 2";
      __line = 0x16;
    }
    else {
      __assertion = "boxcount == 1";
      __line = 0x10;
    }
  }
  else {
    __assertion = "color == \"red\"";
    __line = 0xd;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/flyweight_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  BoxFactory* boxFactory = new BoxFactory();
  Box* redBox = boxFactory->getBox("red");
  boxFactory->getBox("red");

  std::string color = redBox->getColor();
  assert(color == "red");

  int boxcount = boxFactory->boxCount();
  assert(boxcount == 1);

  boxFactory->getBox("green");
  boxFactory->getBox("green");

  boxcount = boxFactory->boxCount();
  assert(boxcount == 2);
}